

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ir.h
# Opt level: O2

void __thiscall wabt::TableImport::TableImport(TableImport *this,string_view name)

{
  ImportMixin<(wabt::ExternalKind)1>::ImportMixin(&this->super_ImportMixin<(wabt::ExternalKind)1>);
  (this->super_ImportMixin<(wabt::ExternalKind)1>).super_Import._vptr_Import =
       (_func_int **)&PTR__TableImport_013e1568;
  Table::Table(&this->table,name);
  return;
}

Assistant:

explicit TableImport(string_view name = string_view())
      : ImportMixin<ExternalKind::Table>(), table(name) {}